

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O3

uint Kit_TruthSemiCanonicize_Yasha1(word *pInOut,int nVars,char *pCanonPerm,int *pStore)

{
  ushort *puVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  bVar2 = (byte)nVars;
  uVar5 = 1 << (bVar2 - 6 & 0x1f);
  if (nVars < 7) {
    uVar5 = 1;
  }
  if (nVars < 0x11) {
    iVar4 = Kit_TruthCountOnes_64bit(pInOut,nVars);
    iVar6 = uVar5 * 0x20;
    if (iVar4 == iVar6) {
      uVar7 = 1 << (bVar2 + 2 & 0x1f);
    }
    else {
      uVar7 = 0;
      if (iVar4 != iVar6 && SBORROW4(iVar4,iVar6) == (int)(iVar4 + uVar5 * -0x20) < 0) {
        uVar7 = 1 << (bVar2 & 0x1f);
        if (0 < (int)uVar5) {
          uVar8 = (ulong)uVar5 + 1;
          do {
            pInOut[uVar8 - 2] = ~pInOut[uVar8 - 2];
            uVar8 = uVar8 - 1;
          } while (1 < uVar8);
        }
        iVar4 = uVar5 * 0x40 - iVar4;
      }
    }
    Kit_TruthCountOnesInCofs_64bit(pInOut,nVars,pStore);
    if (0 < nVars) {
      uVar8 = 0;
      do {
        iVar6 = pStore[uVar8];
        if (iVar6 * 2 == iVar4) {
          uVar7 = uVar7 | 2 << (bVar2 & 0x1f);
        }
        else if (iVar6 <= iVar4 - iVar6) {
          uVar7 = uVar7 | 1 << ((uint)uVar8 & 0x1f);
          pStore[uVar8] = iVar4 - iVar6;
          Kit_TruthChangePhase_64bit(pInOut,nVars,(uint)uVar8);
        }
        uVar8 = uVar8 + 1;
      } while ((uint)nVars != uVar8);
    }
    do {
      if (nVars < 2) {
        return uVar7;
      }
      uVar8 = 0;
      bVar3 = false;
      do {
        if (pStore[uVar8 + 1] < pStore[uVar8]) {
          puVar1 = (ushort *)(pCanonPerm + uVar8);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          *(ulong *)(pStore + uVar8) =
               CONCAT44((int)*(undefined8 *)(pStore + uVar8),
                        (int)((ulong)*(undefined8 *)(pStore + uVar8) >> 0x20));
          uVar5 = 2 << ((byte)uVar8 & 0x1f);
          if ((((uVar7 & uVar5) == 0 ^ (byte)(uVar7 >> ((byte)uVar8 & 0x1f))) & 1) == 0) {
            uVar7 = uVar7 ^ 1 << ((uint)uVar8 & 0x1f) ^ uVar5;
          }
          Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,(uint)uVar8);
          bVar3 = true;
        }
        uVar8 = uVar8 + 1;
      } while (nVars - 1 != uVar8);
    } while (bVar3);
    return uVar7;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckySwap.c"
                ,0xfb,"unsigned int Kit_TruthSemiCanonicize_Yasha1(word *, int, char *, int *)");
}

Assistant:

unsigned  Kit_TruthSemiCanonicize_Yasha1( word* pInOut, int nVars, char * pCanonPerm, int * pStore )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, fChange, nOnes;
    int Temp;
    unsigned  uCanonPhase=0;
    assert( nVars <= 16 );
    
    nOnes = Kit_TruthCountOnes_64bit(pInOut, nVars);
    if ( nOnes == nWords * 32 )
        uCanonPhase |= (1 << (nVars+2));
    
    else if ( (nOnes > nWords * 32) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot_64bit( pInOut, nVars );
        nOnes = nWords*64 - nOnes;
    }
    
    // collect the minterm counts
    Kit_TruthCountOnesInCofs_64bit( pInOut, nVars, pStore );
    
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if (  2*pStore[i]  == nOnes)
        {
            uCanonPhase |= (1 << (nVars+1));
            continue;
        }
        if ( pStore[i] > nOnes-pStore[i])
            continue;
        uCanonPhase |= (1 << i);
        pStore[i] = nOnes-pStore[i]; 
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
    }  
    
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[i] <= pStore[i+1] )
                continue;            
            fChange = 1;
            
            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;
            
            Temp = pStore[i];
            pStore[i] = pStore[i+1];
            pStore[i+1] = Temp;
            
            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }
            
            Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );            
        }
    } while ( fChange );
    return uCanonPhase;
}